

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_loader.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::IrLoader::AddInstruction(IrLoader *this,spv_parsed_instruction_t *inst)

{
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *this_00;
  uint uVar1;
  uint32_t *puVar2;
  IRContext *pIVar3;
  pointer pIVar4;
  char *source;
  Function *pFVar5;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> tVar6;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> __ptr;
  Module *pMVar7;
  pointer puVar8;
  Op OVar9;
  bool bVar10;
  byte bVar11;
  PodType PVar12;
  int32_t iVar13;
  Instruction *i;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_01;
  Instruction *pIVar14;
  pointer pIVar15;
  pointer __p;
  BasicBlock *pBVar16;
  ulong uVar17;
  pointer pIVar18;
  MessageConsumer *pMVar19;
  long lVar20;
  Instruction *pIVar21;
  IntrusiveList<spvtools::opt::Instruction> *pIVar22;
  char *pcVar23;
  Op opcode;
  string message;
  size_type __dnew;
  Op local_9c;
  undefined1 local_98 [24];
  uint *local_80;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_70;
  spv_position_t local_68;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_48;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_40;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> local_38;
  
  this->inst_index_ = this->inst_index_ + 1;
  bVar10 = IsLineInst(inst);
  if (bVar10) {
    this->module_->contains_debug_info_ = true;
    pIVar21 = (this->last_line_inst_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    (this->last_line_inst_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    if (pIVar21 != (Instruction *)0x0) {
      (**(code **)((long)(pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                         _vptr_IntrusiveNodeBase + 8))();
    }
    local_98._0_8_ = this->module_->context_;
    std::vector<spvtools::opt::Instruction,std::allocator<spvtools::opt::Instruction>>::
    emplace_back<spvtools::opt::IRContext*,spv_parsed_instruction_t_const&,spvtools::opt::DebugScope&>
              ((vector<spvtools::opt::Instruction,std::allocator<spvtools::opt::Instruction>> *)
               &this->dbg_line_info_,(IRContext **)local_98,inst,&this->last_dbg_scope_);
    return true;
  }
  local_9c = (Op)inst->opcode;
  bVar10 = spvIsExtendedInstruction(local_9c);
  if ((bVar10) && (bVar10 = spvExtInstIsDebugInfo(inst->ext_inst_type), bVar10)) {
    puVar2 = inst->words;
    if (puVar2[4] == 0x18) {
      (this->last_dbg_scope_).lexical_scope_ = 0;
      (this->last_dbg_scope_).inlined_at_ = 0;
LAB_005a05f4:
      this->module_->contains_debug_info_ = true;
      return true;
    }
    if (puVar2[4] == 0x17) {
      if (inst->num_words < 7) {
        uVar17 = 0;
      }
      else {
        uVar17 = (ulong)puVar2[6] << 0x20;
      }
      this->last_dbg_scope_ = (DebugScope)(puVar2[5] | uVar17);
      goto LAB_005a05f4;
    }
  }
  this_01._M_head_impl = (Instruction *)operator_new(0x70);
  Instruction::Instruction(this_01._M_head_impl,this->module_->context_,inst,&this->dbg_line_info_);
  pIVar15 = ((this_01._M_head_impl)->dbg_line_insts_).
            super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (((this_01._M_head_impl)->dbg_line_insts_).
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start == pIVar15) {
    pIVar21 = (this->last_line_inst_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar21 != (Instruction *)0x0) {
      pIVar21->dbg_scope_ = this->last_dbg_scope_;
      pIVar4 = (pIVar21->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar15 = *(pointer *)
                      &(pIVar21->dbg_line_insts_).
                       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                       ._M_impl; pIVar15 != pIVar4; pIVar15 = pIVar15 + 1) {
        pIVar15->dbg_scope_ = this->last_dbg_scope_;
      }
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
      push_back(&(this_01._M_head_impl)->dbg_line_insts_,
                (this->last_line_inst_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      pIVar14 = Instruction::Clone(((this_01._M_head_impl)->dbg_line_insts_).
                                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1,
                                   this->module_->context_);
      pIVar21 = (this->last_line_inst_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      (this->last_line_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar14;
      if (pIVar21 != (Instruction *)0x0) {
        (**(code **)((long)(pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                           _vptr_IntrusiveNodeBase + 8))();
      }
      bVar10 = Instruction::IsDebugLineInst
                         ((this->last_line_inst_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      if (bVar10) {
        pIVar21 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        pIVar3 = this->module_->context_;
        PVar12.data._M_elems =
             (array<signed_char,_4UL>)
             Module::TakeNextIdBound
                       ((pIVar3->module_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        if ((PVar12.data._M_elems == (_Type)0x0) &&
           ((pIVar3->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
          local_98._0_8_ = local_98 + 0x10;
          local_68.line._0_4_ = (array<signed_char,_4UL>)0x25;
          local_68.line._4_4_ = (array<signed_char,_4UL>)0x0;
          local_98._0_8_ = std::__cxx11::string::_M_create((ulong *)local_98,(ulong)&local_68);
          local_98._16_8_ = local_68.line;
          ((IRContext *)local_98._0_8_)->syntax_context_ = (spv_context)0x667265766f204449;
          *(undefined8 *)&((IRContext *)local_98._0_8_)->grammar_ = 0x797254202e776f6c;
          (((IRContext *)local_98._0_8_)->grammar_).operandTable_ =
               (spv_operand_table)0x676e696e6e757220;
          (((IRContext *)local_98._0_8_)->grammar_).opcodeTable_ =
               (spv_opcode_table)0x746361706d6f6320;
          *(undefined8 *)((long)&(((IRContext *)local_98._0_8_)->grammar_).opcodeTable_ + 5) =
               0x2e7364692d746361;
          local_98._8_8_ = local_68.line;
          *(char *)((long)&((IRContext *)local_98._0_8_)->syntax_context_ + local_68.line) = '\0';
          local_68.line = 0;
          local_68.column = 0;
          local_68.index = 0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(&pIVar3->consumer_,SPV_MSG_ERROR,"",&local_68,(char *)local_98._0_8_);
          if ((IRContext *)local_98._0_8_ != (IRContext *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
        }
        if (pIVar21->has_result_id_ == false) goto LAB_005a09e8;
        if (PVar12.data._M_elems == (_Type)0x0) goto LAB_005a0a07;
        local_80 = (uint *)(local_98 + 0x10);
        local_98._0_8_ = &PTR__SmallVector_00b15d78;
        local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_98._16_4_ = PVar12.data._M_elems;
        local_98._8_8_ = 1;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   (*(long *)&(pIVar21->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl + (ulong)((uint)pIVar21->has_type_id_ * 0x30) + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_98);
        local_98._0_8_ = &PTR__SmallVector_00b15d78;
        if (local_78._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_78,local_78._M_head_impl);
        }
      }
    }
  }
  else {
    if ((this->extra_line_tracking_ == true) &&
       (bVar10 = Instruction::IsNoLine(pIVar15 + -1), !bVar10)) {
      pIVar14 = Instruction::Clone(((this_01._M_head_impl)->dbg_line_insts_).
                                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1,
                                   this->module_->context_);
      pIVar21 = (this->last_line_inst_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      (this->last_line_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar14;
      if (pIVar21 != (Instruction *)0x0) {
        (**(code **)((long)(pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                           _vptr_IntrusiveNodeBase + 8))();
      }
      bVar10 = Instruction::IsDebugLineInst
                         ((this->last_line_inst_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      if (bVar10) {
        pIVar21 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        pIVar3 = this->module_->context_;
        PVar12.data._M_elems =
             (array<signed_char,_4UL>)
             Module::TakeNextIdBound
                       ((pIVar3->module_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        if ((PVar12.data._M_elems == (_Type)0x0) &&
           ((pIVar3->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
          local_98._0_8_ = local_98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"ID overflow. Try running compact-ids.","");
          local_68.line = 0;
          local_68.column = 0;
          local_68.index = 0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(&pIVar3->consumer_,SPV_MSG_ERROR,"",&local_68,(char *)local_98._0_8_);
          if ((IRContext *)local_98._0_8_ != (IRContext *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
        }
        if (pIVar21->has_result_id_ == false) {
LAB_005a09e8:
          __assert_fail("has_result_id_",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
        }
        if (PVar12.data._M_elems == (_Type)0x0) {
LAB_005a0a07:
          __assert_fail("res_id != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
        }
        local_80 = (uint *)(local_98 + 0x10);
        local_98._0_8_ = &PTR__SmallVector_00b15d78;
        local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_98._16_4_ = PVar12.data._M_elems;
        local_98._8_4_ = (array<signed_char,_4UL>)0x1;
        local_98._12_4_ = (array<signed_char,_4UL>)0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   (*(long *)&(pIVar21->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl + (ulong)((uint)pIVar21->has_type_id_ * 0x30) + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_98);
        local_98._0_8_ = &PTR__SmallVector_00b15d78;
        if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
            local_78._M_head_impl !=
            (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0)
        {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_78,local_78._M_head_impl);
        }
      }
    }
    pIVar15 = (this->dbg_line_info_).
              super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar4 = (this->dbg_line_info_).
             super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pIVar18 = pIVar15;
    if (pIVar4 != pIVar15) {
      do {
        (**(pIVar18->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase)
                  (pIVar18);
        pIVar18 = pIVar18 + 1;
      } while (pIVar18 != pIVar4);
      (this->dbg_line_info_).
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish = pIVar15;
    }
  }
  source = (this->source_)._M_dataplus._M_p;
  local_98._0_8_ = ZEXT48(this->inst_index_);
  local_98._8_8_ = 0;
  local_98._16_4_ = (array<signed_char,_4UL>)0x0;
  local_98._20_4_ = (array<signed_char,_4UL>)0x0;
  if (local_9c == OpLabel) {
    if ((this->function_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl == (Function *)0x0) {
      pMVar19 = this->consumer_;
      if ((pMVar19->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar23 = "OpLabel outside function";
LAB_005a0705:
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()(pMVar19,SPV_MSG_ERROR,source,(spv_position_t *)local_98,pcVar23);
      }
    }
    else {
      if ((this->block_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl ==
          (BasicBlock *)0x0) {
        pBVar16 = (BasicBlock *)operator_new(0x88);
        pBVar16->function_ = (Function *)0x0;
        (pBVar16->label_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t = (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 )this_01._M_head_impl;
        pIVar21 = &(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
             (_func_int **)&PTR__Instruction_00b15d30;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.unique_id_ = 0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ =
             (IRContext *)0x0;
        *(undefined8 *)
         ((long)&(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 context_ + 6) = 0;
        *(undefined8 *)
         &(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl = 0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined8 *)
         &(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
          dbg_line_insts_.
          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
          ._M_impl = 0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
        lexical_scope_ = 0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
        inlined_at_ = 0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar21;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar21;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
             (_func_int **)&PTR__InstructionList_00b15dc8;
        (this->block_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = pBVar16;
        goto LAB_005a091e;
      }
      pMVar19 = this->consumer_;
      if ((pMVar19->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar23 = "OpLabel inside basic block";
        goto LAB_005a0705;
      }
    }
    goto LAB_005a0717;
  }
  if (local_9c == OpFunctionEnd) {
    pFVar5 = (this->function_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
    if (pFVar5 == (Function *)0x0) {
      pMVar19 = this->consumer_;
      if ((pMVar19->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar23 = "OpFunctionEnd without corresponding OpFunction";
        goto LAB_005a0705;
      }
    }
    else {
      if ((this->block_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl ==
          (BasicBlock *)0x0) {
        tVar6.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               *)&(pFVar5->end_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ;
        (pFVar5->end_inst_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                )this_01._M_head_impl;
        if (tVar6.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
            (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0) {
          (**(code **)(*(long *)tVar6.
                                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                _M_head_impl + 8))();
        }
        pMVar7 = this->module_;
        local_38._M_head_impl =
             (this->function_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
        (this->function_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl = (Function *)0x0;
        std::
        vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
        ::
        emplace_back<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>
                  ((vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
                    *)&pMVar7->functions_,
                   (unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                    *)&local_38);
        std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
        ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                     *)&local_38);
        std::__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ::reset((__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)&this->function_,(pointer)0x0);
        goto LAB_005a055f;
      }
      pMVar19 = this->consumer_;
      if ((pMVar19->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar23 = "OpFunctionEnd inside basic block";
        goto LAB_005a0705;
      }
    }
    goto LAB_005a0717;
  }
  if (local_9c == OpFunction) {
    if ((this->function_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl == (Function *)0x0) {
      __p = (pointer)operator_new(0xd0);
      (__p->def_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           this_01._M_head_impl;
      (__p->params_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->params_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->params_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar21 = &(__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                 sentinel_;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)&PTR__Instruction_00b15d30;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      unique_id_ = 0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      context_ = (IRContext *)0x0;
      *(undefined8 *)
       ((long)&(__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
               sentinel_.context_ + 6) = 0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      dbg_line_insts_.
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      dbg_line_insts_.
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      dbg_line_insts_.
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      dbg_scope_.lexical_scope_ = 0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      dbg_scope_.inlined_at_ = 0;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar21;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar21;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
      (__p->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
      _vptr_IntrusiveList = (_func_int **)&PTR__InstructionList_00b15dc8;
      (__p->non_semantic_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->non_semantic_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->non_semantic_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p->end_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
      (__p->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.line = 0;
      std::__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
      reset((__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             *)&this->function_,__p);
      std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
      ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                   *)&local_68);
LAB_005a055f:
      this_01._M_head_impl = (Instruction *)0x0;
      bVar10 = true;
      goto LAB_005a0920;
    }
    pMVar19 = this->consumer_;
    if ((pMVar19->super__Function_base)._M_manager != (_Manager_type)0x0) {
      pcVar23 = "function inside function";
      goto LAB_005a0705;
    }
    goto LAB_005a0717;
  }
  bVar10 = spvOpcodeIsBlockTerminator(local_9c);
  pFVar5 = (this->function_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
           .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
  if (bVar10) {
    if (pFVar5 == (Function *)0x0) {
      pMVar19 = this->consumer_;
      if ((pMVar19->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar23 = "terminator instruction outside function";
        goto LAB_005a0705;
      }
    }
    else {
      if ((this->block_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl !=
          (BasicBlock *)0x0) {
        if ((this->last_dbg_scope_).lexical_scope_ != 0) {
          (this_01._M_head_impl)->dbg_scope_ = this->last_dbg_scope_;
          pIVar4 = ((this_01._M_head_impl)->dbg_line_insts_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pIVar15 = ((this_01._M_head_impl)->dbg_line_insts_).
                         super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                         ._M_impl.super__Vector_impl_data._M_start; pIVar15 != pIVar4;
              pIVar15 = pIVar15 + 1) {
            pIVar15->dbg_scope_ = this->last_dbg_scope_;
          }
        }
        this_00 = &this->block_;
        utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                  (&(((this->block_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->
                    insts_).super_IntrusiveList<spvtools::opt::Instruction>,this_01._M_head_impl);
        pFVar5 = (this->function_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                 .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
        local_70._M_head_impl =
             (this->block_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        (this->block_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = (BasicBlock *)0x0;
        opt::Function::AddBasicBlock
                  (pFVar5,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           *)&local_70);
        if (local_70._M_head_impl != (BasicBlock *)0x0) {
          std::default_delete<spvtools::opt::BasicBlock>::operator()
                    ((default_delete<spvtools::opt::BasicBlock> *)&local_70,local_70._M_head_impl);
        }
        local_70._M_head_impl = (BasicBlock *)0x0;
        __ptr._M_head_impl =
             (this_00->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        (this_00->_M_t).
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = (BasicBlock *)0x0;
        if (__ptr._M_head_impl != (BasicBlock *)0x0) {
          std::default_delete<spvtools::opt::BasicBlock>::operator()
                    ((default_delete<spvtools::opt::BasicBlock> *)this_00,__ptr._M_head_impl);
        }
        pIVar21 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        (this->last_line_inst_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             (Instruction *)0x0;
        (this->last_dbg_scope_).lexical_scope_ = 0;
        (this->last_dbg_scope_).inlined_at_ = 0;
        if (pIVar21 != (Instruction *)0x0) {
          (**(code **)((long)(pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                             _vptr_IntrusiveNodeBase + 8))();
        }
        pIVar15 = (this->dbg_line_info_).
                  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar4 = (this->dbg_line_info_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pIVar18 = pIVar15;
        if (pIVar4 != pIVar15) {
          do {
            (**(pIVar18->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
               _vptr_IntrusiveNodeBase)(pIVar18);
            pIVar18 = pIVar18 + 1;
          } while (pIVar18 != pIVar4);
          (this->dbg_line_info_).
          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar15;
        }
        goto LAB_005a091e;
      }
      pMVar19 = this->consumer_;
      if ((pMVar19->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pcVar23 = "terminator instruction outside basic block";
        goto LAB_005a0705;
      }
    }
    goto LAB_005a0717;
  }
  if (pFVar5 != (Function *)0x0) {
    if ((local_9c & ~OpUndef) == OpLoopMerge) {
      (this->last_dbg_scope_).lexical_scope_ = 0;
      (this->last_dbg_scope_).inlined_at_ = 0;
    }
    if ((this->last_dbg_scope_).lexical_scope_ != 0) {
      (this_01._M_head_impl)->dbg_scope_ = this->last_dbg_scope_;
      pIVar4 = ((this_01._M_head_impl)->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar15 = ((this_01._M_head_impl)->dbg_line_insts_).
                     super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                     ._M_impl.super__Vector_impl_data._M_start; pIVar15 != pIVar4;
          pIVar15 = pIVar15 + 1) {
        pIVar15->dbg_scope_ = this->last_dbg_scope_;
      }
    }
    bVar10 = spvIsExtendedInstruction(local_9c);
    if ((bVar10) && (bVar10 = spvExtInstIsDebugInfo(inst->ext_inst_type), bVar10)) {
      uVar1 = inst->words[4];
      if (inst->ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
        if (((uVar1 < 0x1e) && ((0x31800000U >> (uVar1 & 0x1f) & 1) != 0)) || (uVar1 == 0x65)) {
          pBVar16 = (this->block_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          if (pBVar16 != (BasicBlock *)0x0) goto LAB_005a0811;
          Logf<spv::Op_const&>
                    (this->consumer_,SPV_MSG_ERROR,source,(spv_position_t *)local_98,
                     "Debug info extension instruction found inside function but outside block",
                     &local_9c);
          bVar11 = 1;
        }
        else {
LAB_005a0897:
          pMVar19 = this->consumer_;
          pcVar23 = 
          "Debug info extension instruction other than DebugScope, DebugNoScope, DebugDeclare, and DebugValue found inside function"
          ;
LAB_005a08a1:
          Logf<spv::Op_const&>
                    (pMVar19,SPV_MSG_ERROR,source,(spv_position_t *)local_98,pcVar23,&local_9c);
          bVar11 = 0;
        }
      }
      else {
        if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
          if ((uVar1 != 0x1d) && (uVar1 != 0x1c)) {
            pMVar19 = this->consumer_;
            pcVar23 = 
            "Debug info extension instruction other than DebugScope, DebugNoScope, DebugFunctionDefinition, DebugDeclare, and DebugValue found inside function"
            ;
            goto LAB_005a08a1;
          }
        }
        else if ((uVar1 != 0x1d) && (uVar1 != 0x1c)) goto LAB_005a0897;
        pBVar16 = (this->block_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        if (pBVar16 == (BasicBlock *)0x0) {
          pIVar22 = &(((this->function_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                       .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl)->
                     debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>;
        }
        else {
LAB_005a0811:
          pIVar22 = &(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>;
        }
        utils::IntrusiveList<spvtools::opt::Instruction>::push_back(pIVar22,this_01._M_head_impl);
        bVar11 = 1;
        this_01._M_head_impl = (Instruction *)0x0;
      }
      bVar10 = (bool)(bVar11 != 0 | bVar11);
      goto LAB_005a0920;
    }
    pBVar16 = (this->block_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    if (pBVar16 != (BasicBlock *)0x0) {
      pIVar22 = &(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>;
      goto LAB_005a0913;
    }
    if (local_9c == OpFunctionParameter) {
      local_48._M_head_impl = this_01._M_head_impl;
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                  *)&((this->function_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl)->
                     params_,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_48);
      if (local_48._M_head_impl != (Instruction *)0x0) {
        (*((local_48._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
      local_48._M_head_impl = (Instruction *)0x0;
      goto LAB_005a091e;
    }
    pMVar19 = this->consumer_;
    pcVar23 = "Non-OpFunctionParameter (opcode: %d) found inside function but outside basic block";
    goto LAB_005a0763;
  }
  if ((this->block_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != (BasicBlock *)0x0)
  {
    local_68.line = 0xb7;
    local_68.column = 0;
    local_68.index = 0;
    Log(this->consumer_,SPV_MSG_INTERNAL_ERROR,
        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_loader.cpp"
        ,&local_68,"assertion failed: block_ == nullptr");
    exit(1);
  }
  switch(local_9c) {
  case OpSourceContinued:
  case OpSource:
  case OpSourceExtension:
  case OpString:
    lVar20 = 0x288;
    break;
  case OpName:
  case OpMemberName:
  case OpLine:
  case OpLine|OpUndef:
  case OpExtInst:
  case OpExtInst|OpUndef:
    goto switchD_005a06e8_caseD_5;
  case OpExtension:
    lVar20 = 0x98;
    break;
  case OpExtInstImport:
    lVar20 = 0x110;
    break;
  case OpMemoryModel:
    pIVar21 = (this->module_->memory_model_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    (this->module_->memory_model_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = this_01._M_head_impl;
LAB_005a0853:
    if (pIVar21 != (Instruction *)0x0) {
      (*(pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])()
      ;
    }
    goto LAB_005a091e;
  case OpEntryPoint:
    lVar20 = 0x198;
    break;
  case OpExecutionMode:
switchD_005a06e8_caseD_10:
    lVar20 = 0x210;
    break;
  case OpCapability:
    pIVar22 = &(this->module_->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>;
    goto LAB_005a0913;
  default:
    if (local_9c == OpExecutionModeId) goto switchD_005a06e8_caseD_10;
    if (local_9c == OpSamplerImageAddressingModeNV) {
      pIVar21 = (this->module_->sampled_image_address_mode_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      (this->module_->sampled_image_address_mode_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           this_01._M_head_impl;
      goto LAB_005a0853;
    }
switchD_005a06e8_caseD_5:
    if (local_9c - OpName < 2) {
      lVar20 = 0x300;
      break;
    }
    if (local_9c == OpModuleProcessed) {
      lVar20 = 0x378;
      break;
    }
    bVar10 = IsAnnotationInst(local_9c);
    OVar9 = local_9c;
    if (bVar10) {
      lVar20 = 0x468;
      break;
    }
    iVar13 = spvOpcodeGeneratesType(local_9c);
    if ((((OVar9 == OpTypeForwardPointer) || (iVar13 != 0)) ||
        (iVar13 = spvOpcodeIsConstant(local_9c), iVar13 != 0)) ||
       ((local_9c == OpVariable || (local_9c == OpUndef)))) {
      lVar20 = 0x4e0;
      break;
    }
    bVar10 = spvIsExtendedInstruction(local_9c);
    if ((bVar10) && (bVar10 = spvExtInstIsDebugInfo(inst->ext_inst_type), bVar10)) {
      lVar20 = 0x3f0;
      break;
    }
    bVar10 = spvIsExtendedInstruction(local_9c);
    if ((!bVar10) || (bVar10 = spvExtInstIsNonSemantic(inst->ext_inst_type), !bVar10)) {
      pMVar19 = this->consumer_;
      pcVar23 = "Unhandled inst type (opcode: %d) found outside function definition.";
LAB_005a0763:
      Logf<spv::Op_const&>
                (pMVar19,SPV_MSG_ERROR,source,(spv_position_t *)local_98,pcVar23,&local_9c);
LAB_005a0717:
      bVar10 = false;
      goto LAB_005a0920;
    }
    pMVar7 = this->module_;
    puVar8 = (pMVar7->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pMVar7->functions_).
        super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == puVar8) {
      pIVar22 = &(pMVar7->types_values_).super_IntrusiveList<spvtools::opt::Instruction>;
      goto LAB_005a0913;
    }
    local_40._M_head_impl = this_01._M_head_impl;
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                *)&(puVar8[-1]._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl)->
                   non_semantic_,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*((local_40._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
    local_40._M_head_impl = (Instruction *)0x0;
    goto LAB_005a091e;
  }
  pIVar22 = (IntrusiveList<spvtools::opt::Instruction> *)
            ((long)&(this->module_->header_).magic_number + lVar20);
LAB_005a0913:
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back(pIVar22,this_01._M_head_impl);
LAB_005a091e:
  bVar10 = true;
  this_01._M_head_impl = (Instruction *)0x0;
LAB_005a0920:
  if (this_01._M_head_impl != (Instruction *)0x0) {
    (*((this_01._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])(this_01._M_head_impl);
  }
  return bVar10;
}

Assistant:

bool IrLoader::AddInstruction(const spv_parsed_instruction_t* inst) {
  ++inst_index_;
  if (IsLineInst(inst)) {
    module()->SetContainsDebugInfo();
    last_line_inst_.reset();
    dbg_line_info_.emplace_back(module()->context(), *inst, last_dbg_scope_);
    return true;
  }

  // If it is a DebugScope or DebugNoScope of debug extension, we do not
  // create a new instruction, but simply keep the information in
  // struct DebugScope.
  const auto opcode = static_cast<spv::Op>(inst->opcode);
  if (spvIsExtendedInstruction(opcode) &&
      spvExtInstIsDebugInfo(inst->ext_inst_type)) {
    const uint32_t ext_inst_index = inst->words[kExtInstSetIndex];
    if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100 ||
        inst->ext_inst_type ==
            SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
      const CommonDebugInfoInstructions ext_inst_key =
          CommonDebugInfoInstructions(ext_inst_index);
      if (ext_inst_key == CommonDebugInfoDebugScope) {
        uint32_t inlined_at = 0;
        if (inst->num_words > kInlinedAtIndex)
          inlined_at = inst->words[kInlinedAtIndex];
        last_dbg_scope_ =
            DebugScope(inst->words[kLexicalScopeIndex], inlined_at);
        module()->SetContainsDebugInfo();
        return true;
      }
      if (ext_inst_key == CommonDebugInfoDebugNoScope) {
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
        module()->SetContainsDebugInfo();
        return true;
      }
    } else {
      const DebugInfoInstructions ext_inst_key =
          DebugInfoInstructions(ext_inst_index);
      if (ext_inst_key == DebugInfoDebugScope) {
        uint32_t inlined_at = 0;
        if (inst->num_words > kInlinedAtIndex)
          inlined_at = inst->words[kInlinedAtIndex];
        last_dbg_scope_ =
            DebugScope(inst->words[kLexicalScopeIndex], inlined_at);
        module()->SetContainsDebugInfo();
        return true;
      }
      if (ext_inst_key == DebugInfoDebugNoScope) {
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
        module()->SetContainsDebugInfo();
        return true;
      }
    }
  }

  std::unique_ptr<Instruction> spv_inst(
      new Instruction(module()->context(), *inst, std::move(dbg_line_info_)));
  if (!spv_inst->dbg_line_insts().empty()) {
    if (extra_line_tracking_ &&
        (!spv_inst->dbg_line_insts().back().IsNoLine())) {
      last_line_inst_ = std::unique_ptr<Instruction>(
          spv_inst->dbg_line_insts().back().Clone(module()->context()));
      if (last_line_inst_->IsDebugLineInst())
        last_line_inst_->SetResultId(module()->context()->TakeNextId());
    }
    dbg_line_info_.clear();
  } else if (last_line_inst_ != nullptr) {
    last_line_inst_->SetDebugScope(last_dbg_scope_);
    spv_inst->dbg_line_insts().push_back(*last_line_inst_);
    last_line_inst_ = std::unique_ptr<Instruction>(
        spv_inst->dbg_line_insts().back().Clone(module()->context()));
    if (last_line_inst_->IsDebugLineInst())
      last_line_inst_->SetResultId(module()->context()->TakeNextId());
  }

  const char* src = source_.c_str();
  spv_position_t loc = {inst_index_, 0, 0};

  // Handle function and basic block boundaries first, then normal
  // instructions.
  if (opcode == spv::Op::OpFunction) {
    if (function_ != nullptr) {
      Error(consumer_, src, loc, "function inside function");
      return false;
    }
    function_ = MakeUnique<Function>(std::move(spv_inst));
  } else if (opcode == spv::Op::OpFunctionEnd) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc,
            "OpFunctionEnd without corresponding OpFunction");
      return false;
    }
    if (block_ != nullptr) {
      Error(consumer_, src, loc, "OpFunctionEnd inside basic block");
      return false;
    }
    function_->SetFunctionEnd(std::move(spv_inst));
    module_->AddFunction(std::move(function_));
    function_ = nullptr;
  } else if (opcode == spv::Op::OpLabel) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc, "OpLabel outside function");
      return false;
    }
    if (block_ != nullptr) {
      Error(consumer_, src, loc, "OpLabel inside basic block");
      return false;
    }
    block_ = MakeUnique<BasicBlock>(std::move(spv_inst));
  } else if (spvOpcodeIsBlockTerminator(opcode)) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc, "terminator instruction outside function");
      return false;
    }
    if (block_ == nullptr) {
      Error(consumer_, src, loc, "terminator instruction outside basic block");
      return false;
    }
    if (last_dbg_scope_.GetLexicalScope() != kNoDebugScope)
      spv_inst->SetDebugScope(last_dbg_scope_);
    block_->AddInstruction(std::move(spv_inst));
    function_->AddBasicBlock(std::move(block_));
    block_ = nullptr;
    last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
    last_line_inst_.reset();
    dbg_line_info_.clear();
  } else {
    if (function_ == nullptr) {  // Outside function definition
      SPIRV_ASSERT(consumer_, block_ == nullptr);
      if (opcode == spv::Op::OpCapability) {
        module_->AddCapability(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExtension) {
        module_->AddExtension(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExtInstImport) {
        module_->AddExtInstImport(std::move(spv_inst));
      } else if (opcode == spv::Op::OpMemoryModel) {
        module_->SetMemoryModel(std::move(spv_inst));
      } else if (opcode == spv::Op::OpSamplerImageAddressingModeNV) {
        module_->SetSampledImageAddressMode(std::move(spv_inst));
      } else if (opcode == spv::Op::OpEntryPoint) {
        module_->AddEntryPoint(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExecutionMode ||
                 opcode == spv::Op::OpExecutionModeId) {
        module_->AddExecutionMode(std::move(spv_inst));
      } else if (IsDebug1Inst(opcode)) {
        module_->AddDebug1Inst(std::move(spv_inst));
      } else if (IsDebug2Inst(opcode)) {
        module_->AddDebug2Inst(std::move(spv_inst));
      } else if (IsDebug3Inst(opcode)) {
        module_->AddDebug3Inst(std::move(spv_inst));
      } else if (IsAnnotationInst(opcode)) {
        module_->AddAnnotationInst(std::move(spv_inst));
      } else if (IsTypeInst(opcode)) {
        module_->AddType(std::move(spv_inst));
      } else if (IsConstantInst(opcode) || opcode == spv::Op::OpVariable ||
                 opcode == spv::Op::OpUndef) {
        module_->AddGlobalValue(std::move(spv_inst));
      } else if (spvIsExtendedInstruction(opcode) &&
                 spvExtInstIsDebugInfo(inst->ext_inst_type)) {
        module_->AddExtInstDebugInfo(std::move(spv_inst));
      } else if (spvIsExtendedInstruction(opcode) &&
                 spvExtInstIsNonSemantic(inst->ext_inst_type)) {
        // If there are no functions, add the non-semantic instructions to the
        // global values. Otherwise append it to the list of the last function.
        auto func_begin = module_->begin();
        auto func_end = module_->end();
        if (func_begin == func_end) {
          module_->AddGlobalValue(std::move(spv_inst));
        } else {
          (--func_end)->AddNonSemanticInstruction(std::move(spv_inst));
        }
      } else {
        Errorf(consumer_, src, loc,
               "Unhandled inst type (opcode: %d) found outside function "
               "definition.",
               opcode);
        return false;
      }
    } else {
      if (opcode == spv::Op::OpLoopMerge || opcode == spv::Op::OpSelectionMerge)
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
      if (last_dbg_scope_.GetLexicalScope() != kNoDebugScope)
        spv_inst->SetDebugScope(last_dbg_scope_);
      if (spvIsExtendedInstruction(opcode) &&
          spvExtInstIsDebugInfo(inst->ext_inst_type)) {
        const uint32_t ext_inst_index = inst->words[kExtInstSetIndex];
        if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
          const OpenCLDebugInfo100Instructions ext_inst_key =
              OpenCLDebugInfo100Instructions(ext_inst_index);
          switch (ext_inst_key) {
            case OpenCLDebugInfo100DebugDeclare: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            case OpenCLDebugInfo100DebugValue: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugFunctionDefinition, DebugDeclare, and "
                     "DebugValue found inside function",
                     opcode);
              return false;
            }
          }
        } else if (inst->ext_inst_type ==
                   SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
          const NonSemanticShaderDebugInfo100Instructions ext_inst_key =
              NonSemanticShaderDebugInfo100Instructions(ext_inst_index);
          switch (ext_inst_key) {
            case NonSemanticShaderDebugInfo100DebugDeclare:
            case NonSemanticShaderDebugInfo100DebugValue:
            case NonSemanticShaderDebugInfo100DebugScope:
            case NonSemanticShaderDebugInfo100DebugNoScope:
            case NonSemanticShaderDebugInfo100DebugFunctionDefinition: {
              if (block_ == nullptr) {  // Inside function but outside blocks
                Errorf(consumer_, src, loc,
                       "Debug info extension instruction found inside function "
                       "but outside block",
                       opcode);
              } else {
                block_->AddInstruction(std::move(spv_inst));
              }
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugDeclare, and DebugValue found inside "
                     "function",
                     opcode);
              return false;
            }
          }
        } else {
          const DebugInfoInstructions ext_inst_key =
              DebugInfoInstructions(ext_inst_index);
          switch (ext_inst_key) {
            case DebugInfoDebugDeclare: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            case DebugInfoDebugValue: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugDeclare, and DebugValue found inside "
                     "function",
                     opcode);
              return false;
            }
          }
        }
      } else {
        if (block_ == nullptr) {  // Inside function but outside blocks
          if (opcode != spv::Op::OpFunctionParameter) {
            Errorf(consumer_, src, loc,
                   "Non-OpFunctionParameter (opcode: %d) found inside "
                   "function but outside basic block",
                   opcode);
            return false;
          }
          function_->AddParameter(std::move(spv_inst));
        } else {
          block_->AddInstruction(std::move(spv_inst));
        }
      }
    }
  }
  return true;
}